

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageLabelDocumentHelper::getLabelsForPageRange
          (QPDFPageLabelDocumentHelper *this,longlong start_idx,longlong end_idx,
          longlong new_start_idx,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_labels)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  bool bVar3;
  __type_conflict1 _Var4;
  size_type sVar5;
  reference pvVar6;
  longlong lVar7;
  longlong lVar8;
  __shared_ptr_access<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *this_01;
  QPDFObjectHandle *this_02;
  bool local_432;
  bool local_3a9;
  QPDFObjectHandle local_360;
  byte local_349;
  element_type *local_338;
  longlong i;
  longlong idx_offset;
  long local_318;
  longlong idx_delta;
  string local_308 [32];
  QPDFObjectHandle local_2e8;
  allocator<char> local_2d1;
  string local_2d0 [32];
  QPDFObjectHandle local_2b0;
  long local_2a0;
  longlong st_delta;
  string local_290 [32];
  QPDFObjectHandle local_270;
  byte local_25c;
  byte local_25b;
  byte local_25a;
  allocator<char> local_259;
  string local_258 [32];
  QPDFObjectHandle local_238;
  byte local_225;
  byte local_224;
  byte local_223;
  byte local_222;
  allocator<char> local_221;
  string local_220 [32];
  QPDFObjectHandle local_200;
  string local_1f0;
  byte local_1cd;
  byte local_1cc;
  byte local_1cb;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8 [32];
  QPDFObjectHandle local_1a8;
  string local_198;
  byte local_175;
  byte local_174;
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  string local_170 [32];
  QPDFObjectHandle local_150;
  string local_140;
  byte local_11d;
  byte local_11c;
  byte local_11b;
  byte local_11a;
  allocator<char> local_119;
  string local_118 [32];
  QPDFObjectHandle local_f8;
  string local_e8;
  undefined1 local_c8 [8];
  QPDFObjectHandle last_idx;
  QPDFObjectHandle last;
  bool skip_first;
  size_t size;
  allocator<char> local_81;
  string local_80;
  QPDFObjectHandle local_60 [2];
  undefined1 local_40 [8];
  QPDFObjectHandle label;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_labels_local;
  longlong new_start_idx_local;
  longlong end_idx_local;
  longlong start_idx_local;
  QPDFPageLabelDocumentHelper *this_local;
  
  label.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_labels;
  getLabelForPage((QPDFPageLabelDocumentHelper *)local_40,(longlong)this);
  bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_40);
  if (bVar2) {
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_40,local_60);
    QPDFObjectHandle::~QPDFObjectHandle(local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/St",&local_81);
    QPDFObjectHandle::newInteger((QPDFObjectHandle *)&size,new_start_idx + 1);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_40,&local_80,(QPDFObjectHandle *)&size);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&size);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     label.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  bVar2 = false;
  if (1 < sVar5) {
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                        label.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        ,sVar5 - 1);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)
               &last_idx.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar6);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                        label.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        ,sVar5 - 2);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_c8,pvVar6);
    local_11a = 0;
    local_11b = 0;
    local_11c = 0;
    local_11d = 0;
    local_172 = 0;
    local_173 = 0;
    local_174 = 0;
    local_175 = 0;
    local_1ca = 0;
    local_1cb = 0;
    local_1cc = 0;
    local_1cd = 0;
    local_222 = 0;
    local_223 = 0;
    local_224 = 0;
    local_225 = 0;
    local_25a = 0;
    local_25b = 0;
    local_25c = 0;
    st_delta._6_1_ = 0;
    st_delta._5_1_ = 0;
    st_delta._4_1_ = 0;
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_c8);
    local_3a9 = false;
    if (bVar3) {
      bVar3 = QPDFObjectHandle::isDictionary
                        ((QPDFObjectHandle *)
                         &last_idx.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_3a9 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_11a = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_118,"/S",&local_119);
        local_11b = 1;
        QPDFObjectHandle::getKey(&local_f8,(string *)local_40);
        local_11c = 1;
        QPDFObjectHandle::unparse_abi_cxx11_(&local_e8,&local_f8);
        local_11d = 1;
        std::allocator<char>::allocator();
        local_172 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_170,"/S",&local_171);
        local_173 = 1;
        QPDFObjectHandle::getKey
                  (&local_150,
                   (string *)
                   &last_idx.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        local_174 = 1;
        QPDFObjectHandle::unparse_abi_cxx11_(&local_140,&local_150);
        local_175 = 1;
        _Var4 = std::operator==(&local_e8,&local_140);
        local_3a9 = false;
        if (_Var4) {
          std::allocator<char>::allocator();
          local_1ca = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_1c8,"/P",&local_1c9);
          local_1cb = 1;
          QPDFObjectHandle::getKey(&local_1a8,(string *)local_40);
          local_1cc = 1;
          QPDFObjectHandle::unparse_abi_cxx11_(&local_198,&local_1a8);
          local_1cd = 1;
          std::allocator<char>::allocator();
          local_222 = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_220,"/P",&local_221);
          local_223 = 1;
          QPDFObjectHandle::getKey
                    (&local_200,
                     (string *)
                     &last_idx.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          local_224 = 1;
          QPDFObjectHandle::unparse_abi_cxx11_(&local_1f0,&local_200);
          local_225 = 1;
          _Var4 = std::operator==(&local_198,&local_1f0);
          local_3a9 = false;
          if (_Var4) {
            std::allocator<char>::allocator();
            local_25a = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_258,"/St",&local_259);
            local_25b = 1;
            QPDFObjectHandle::getKey(&local_238,(string *)local_40);
            local_25c = 1;
            bVar3 = QPDFObjectHandle::isInteger(&local_238);
            local_3a9 = false;
            if (bVar3) {
              std::allocator<char>::allocator();
              st_delta._6_1_ = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_290,"/St",(allocator<char> *)((long)&st_delta + 7));
              st_delta._5_1_ = 1;
              QPDFObjectHandle::getKey
                        (&local_270,
                         (string *)
                         &last_idx.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              st_delta._4_1_ = 1;
              local_3a9 = QPDFObjectHandle::isInteger(&local_270);
            }
          }
        }
      }
    }
    if ((st_delta._4_1_ & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_270);
    }
    if ((st_delta._5_1_ & 1) != 0) {
      std::__cxx11::string::~string(local_290);
    }
    if ((st_delta._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&st_delta + 7));
    }
    if ((local_25c & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_238);
    }
    if ((local_25b & 1) != 0) {
      std::__cxx11::string::~string(local_258);
    }
    if ((local_25a & 1) != 0) {
      std::allocator<char>::~allocator(&local_259);
    }
    if ((local_225 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    if ((local_224 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_200);
    }
    if ((local_223 & 1) != 0) {
      std::__cxx11::string::~string(local_220);
    }
    if ((local_222 & 1) != 0) {
      std::allocator<char>::~allocator(&local_221);
    }
    if ((local_1cd & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_198);
    }
    if ((local_1cc & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
    }
    if ((local_1cb & 1) != 0) {
      std::__cxx11::string::~string(local_1c8);
    }
    if ((local_1ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c9);
    }
    if ((local_175 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_140);
    }
    if ((local_174 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_150);
    }
    if ((local_173 & 1) != 0) {
      std::__cxx11::string::~string(local_170);
    }
    if ((local_172 & 1) != 0) {
      std::allocator<char>::~allocator(&local_171);
    }
    if ((local_11d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if ((local_11c & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
    }
    if ((local_11b & 1) != 0) {
      std::__cxx11::string::~string(local_118);
    }
    if ((local_11a & 1) != 0) {
      std::allocator<char>::~allocator(&local_119);
    }
    if (local_3a9 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d0,"/St",&local_2d1);
      QPDFObjectHandle::getKey(&local_2b0,(string *)local_40);
      lVar7 = QPDFObjectHandle::getIntValue(&local_2b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_308,"/St",(allocator<char> *)((long)&idx_delta + 7));
      QPDFObjectHandle::getKey
                (&local_2e8,
                 (string *)
                 &last_idx.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar8 = QPDFObjectHandle::getIntValue(&local_2e8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_2e8);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator((allocator<char> *)((long)&idx_delta + 7));
      QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      local_2a0 = lVar7 - lVar8;
      lVar7 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_c8);
      local_318 = new_start_idx - lVar7;
      bVar2 = local_2a0 == local_318;
      if (bVar2) {
        QTC::TC("qpdf","QPDFPageLabelDocumentHelper skip first",0);
      }
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c8);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &last_idx.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  _Var1._M_pi = label.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (!bVar2) {
    QPDFObjectHandle::newInteger((QPDFObjectHandle *)&idx_offset,new_start_idx);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)_Var1._M_pi,
               (value_type *)&idx_offset);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&idx_offset);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               label.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,(value_type *)local_40);
  }
  i = new_start_idx - start_idx;
  for (local_338 = (element_type *)(start_idx + 1); (long)local_338 <= end_idx;
      local_338 = (element_type *)
                  ((long)&(local_338->labels).
                          super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1)) {
    this_00 = (__shared_ptr_access<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 __shared_ptr_access<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
    this_01 = std::
              __shared_ptr_access<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    local_349 = 0;
    bVar2 = QPDFNumberTreeObjectHelper::hasIndex(this_01,(numtree_number)local_338);
    local_432 = false;
    if (bVar2) {
      getLabelForPage((QPDFPageLabelDocumentHelper *)&stack0xfffffffffffffcb8,(longlong)this);
      local_349 = 1;
      this_02 = QPDFObjectHandle::operator=
                          ((QPDFObjectHandle *)local_40,(QPDFObjectHandle *)&stack0xfffffffffffffcb8
                          );
      local_432 = QPDFObjectHandle::isDictionary(this_02);
    }
    if ((local_349 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffcb8);
    }
    _Var1._M_pi = label.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_432 != false) {
      QPDFObjectHandle::newInteger
                (&local_360,
                 (long)&(local_338->labels).
                        super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + i);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)_Var1._M_pi,
                 &local_360);
      QPDFObjectHandle::~QPDFObjectHandle(&local_360);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                 label.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                 (value_type *)local_40);
    }
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  return;
}

Assistant:

void
QPDFPageLabelDocumentHelper::getLabelsForPageRange(
    long long start_idx,
    long long end_idx,
    long long new_start_idx,
    std::vector<QPDFObjectHandle>& new_labels)
{
    // Start off with a suitable label for the first page. For every remaining page, if that page
    // has an explicit entry, copy it. Otherwise, let the subsequent page just sequence from the
    // prior entry. If there is no entry for the first page, fabricate one that would match how the
    // page would look in a new file in which it also didn't have an explicit label.
    QPDFObjectHandle label = getLabelForPage(start_idx);
    if (label.isNull()) {
        label = QPDFObjectHandle::newDictionary();
        label.replaceKey("/St", QPDFObjectHandle::newInteger(1 + new_start_idx));
    }
    // See if the new label is redundant based on the previous entry in the vector. If so, don't add
    // it.
    size_t size = new_labels.size();
    bool skip_first = false;
    if (size >= 2) {
        QPDFObjectHandle last = new_labels.at(size - 1);
        QPDFObjectHandle last_idx = new_labels.at(size - 2);
        if (last_idx.isInteger() && last.isDictionary() &&
            (label.getKey("/S").unparse() == last.getKey("/S").unparse()) &&
            (label.getKey("/P").unparse() == last.getKey("/P").unparse()) &&
            label.getKey("/St").isInteger() && last.getKey("/St").isInteger()) {
            long long int st_delta =
                label.getKey("/St").getIntValue() - last.getKey("/St").getIntValue();
            long long int idx_delta = new_start_idx - last_idx.getIntValue();
            if (st_delta == idx_delta) {
                QTC::TC("qpdf", "QPDFPageLabelDocumentHelper skip first");
                skip_first = true;
            }
        }
    }
    if (!skip_first) {
        new_labels.push_back(QPDFObjectHandle::newInteger(new_start_idx));
        new_labels.push_back(label);
    }

    long long int idx_offset = new_start_idx - start_idx;
    for (long long i = start_idx + 1; i <= end_idx; ++i) {
        if (m->labels->hasIndex(i) && (label = getLabelForPage(i)).isDictionary()) {
            new_labels.push_back(QPDFObjectHandle::newInteger(i + idx_offset));
            new_labels.push_back(label);
        }
    }
}